

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RateLimiterTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::utils::RateLimiter_testRateLimiter_Test::TestBody
          (RateLimiter_testRateLimiter_Test *this)

{
  bool bVar1;
  duration dVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  AssertHelper aAStack_98 [8];
  Message local_90 [8];
  AssertionResult local_88 [2];
  AssertionResult gtest_ar_;
  RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock> local_58;
  
  dVar2.__r = std::chrono::_V2::steady_clock::now();
  local_58._creditsPerSecond = 2.0;
  local_58._maxBalance = 2.0;
  local_58._balance = 2.0;
  local_58._mutex.super___mutex_base._M_mutex.__align = 0;
  local_58._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  local_58._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  local_58._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_58._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  _ZN13jaegertracing5utils12_GLOBAL__N_111currentTimeE_0.__r = dVar2.__r;
  local_58._lastTick.__d.__r = (duration)(duration)dVar2.__r;
  gtest_ar_.success_ =
       RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                 (&local_58,0.0);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    gtest_ar_.success_ =
         RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                   (&local_58,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (gtest_ar_.success_) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      bVar1 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                        (&local_58,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      gtest_ar_.success_ = !bVar1;
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (gtest_ar_.success_) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        _ZN13jaegertracing5utils12_GLOBAL__N_111currentTimeE_0.__r = dVar2.__r + 250000000;
        bVar1 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                          (&local_58,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
        gtest_ar_.success_ = !bVar1;
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (gtest_ar_.success_) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_.message_);
          _ZN13jaegertracing5utils12_GLOBAL__N_111currentTimeE_0.__r = dVar2.__r + 750000000;
          gtest_ar_.success_ =
               RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                         (&local_58,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
          gtest_ar_.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (gtest_ar_.success_) {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar_.message_);
            bVar1 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                              (&local_58,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
            gtest_ar_.success_ = !bVar1;
            gtest_ar_.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (gtest_ar_.success_) {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar_.message_);
              _ZN13jaegertracing5utils12_GLOBAL__N_111currentTimeE_0.__r = dVar2.__r + 5000000000;
              gtest_ar_.success_ =
                   RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                             (&local_58,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
              gtest_ar_.message_.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (gtest_ar_.success_) {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar_.message_);
                gtest_ar_.success_ =
                     RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::
                     checkCredit(&local_58,(double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05)
                                );
                gtest_ar_.message_.ptr_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (gtest_ar_.success_) {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(&gtest_ar_.message_);
                  bVar1 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::
                          checkCredit(&local_58,
                                      (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
                  gtest_ar_.success_ = !bVar1;
                  gtest_ar_.message_.ptr_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                  if (gtest_ar_.success_) {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr(&gtest_ar_.message_);
                    bVar1 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::
                            checkCredit(&local_58,
                                        (double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
                    gtest_ar_.success_ = !bVar1;
                    gtest_ar_.message_.ptr_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                    if (gtest_ar_.success_) {
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr(&gtest_ar_.message_);
                      bVar1 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::
                              checkCredit(&local_58,
                                          (double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08))
                      ;
                      gtest_ar_.success_ = !bVar1;
                      gtest_ar_.message_.ptr_ =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                      if (gtest_ar_.success_) goto LAB_001e0686;
                      testing::Message::Message(local_90);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                (local_88,&gtest_ar_.success_,"limiter.checkCredit(1)","true");
                      testing::internal::AssertHelper::AssertHelper
                                (aAStack_98,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                                 ,0x3f,(char *)local_88[0]._0_8_);
                      testing::internal::AssertHelper::operator=(aAStack_98,local_90);
                    }
                    else {
                      testing::Message::Message(local_90);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                (local_88,&gtest_ar_.success_,"limiter.checkCredit(1)","true");
                      testing::internal::AssertHelper::AssertHelper
                                (aAStack_98,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                                 ,0x3e,(char *)local_88[0]._0_8_);
                      testing::internal::AssertHelper::operator=(aAStack_98,local_90);
                    }
                  }
                  else {
                    testing::Message::Message(local_90);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (local_88,&gtest_ar_.success_,"limiter.checkCredit(1)","true");
                    testing::internal::AssertHelper::AssertHelper
                              (aAStack_98,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                               ,0x3d,(char *)local_88[0]._0_8_);
                    testing::internal::AssertHelper::operator=(aAStack_98,local_90);
                  }
                }
                else {
                  testing::Message::Message(local_90);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (local_88,&gtest_ar_.success_,"limiter.checkCredit(1)","false");
                  testing::internal::AssertHelper::AssertHelper
                            (aAStack_98,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                             ,0x3c,(char *)local_88[0]._0_8_);
                  testing::internal::AssertHelper::operator=(aAStack_98,local_90);
                }
              }
              else {
                testing::Message::Message(local_90);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (local_88,&gtest_ar_.success_,"limiter.checkCredit(1)","false");
                testing::internal::AssertHelper::AssertHelper
                          (aAStack_98,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                           ,0x3b,(char *)local_88[0]._0_8_);
                testing::internal::AssertHelper::operator=(aAStack_98,local_90);
              }
            }
            else {
              testing::Message::Message(local_90);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (local_88,&gtest_ar_.success_,"limiter.checkCredit(1)","true");
              testing::internal::AssertHelper::AssertHelper
                        (aAStack_98,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                         ,0x38,(char *)local_88[0]._0_8_);
              testing::internal::AssertHelper::operator=(aAStack_98,local_90);
            }
          }
          else {
            testing::Message::Message(local_90);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (local_88,&gtest_ar_.success_,"limiter.checkCredit(1)","false");
            testing::internal::AssertHelper::AssertHelper
                      (aAStack_98,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                       ,0x37,(char *)local_88[0]._0_8_);
            testing::internal::AssertHelper::operator=(aAStack_98,local_90);
          }
        }
        else {
          testing::Message::Message(local_90);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (local_88,&gtest_ar_.success_,"limiter.checkCredit(1)","true");
          testing::internal::AssertHelper::AssertHelper
                    (aAStack_98,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                     ,0x34,(char *)local_88[0]._0_8_);
          testing::internal::AssertHelper::operator=(aAStack_98,local_90);
        }
      }
      else {
        testing::Message::Message(local_90);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (local_88,&gtest_ar_.success_,"limiter.checkCredit(1)","true");
        testing::internal::AssertHelper::AssertHelper
                  (aAStack_98,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                   ,0x31,(char *)local_88[0]._0_8_);
        testing::internal::AssertHelper::operator=(aAStack_98,local_90);
      }
    }
    else {
      testing::Message::Message(local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (local_88,&gtest_ar_.success_,"limiter.checkCredit(1)","false");
      testing::internal::AssertHelper::AssertHelper
                (aAStack_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                 ,0x30,(char *)local_88[0]._0_8_);
      testing::internal::AssertHelper::operator=(aAStack_98,local_90);
    }
  }
  else {
    testing::Message::Message(local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_88,&gtest_ar_.success_,"limiter.checkCredit(1)","false");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
               ,0x2f,(char *)local_88[0]._0_8_);
    testing::internal::AssertHelper::operator=(aAStack_98,local_90);
  }
  testing::internal::AssertHelper::~AssertHelper(aAStack_98);
  std::__cxx11::string::~string((string *)local_88);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_90);
LAB_001e0686:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST(RateLimiter, testRateLimiter)
{
    const auto timestamp = std::chrono::steady_clock::now();
    currentTime = timestamp;
    RateLimiter<MockClock> limiter(2, 2);

    ASSERT_TRUE(limiter.checkCredit(1));
    ASSERT_TRUE(limiter.checkCredit(1));
    ASSERT_FALSE(limiter.checkCredit(1));

    currentTime = timestamp + std::chrono::milliseconds(250);
    ASSERT_FALSE(limiter.checkCredit(1));

    currentTime = timestamp + std::chrono::milliseconds(750);
    ASSERT_TRUE(limiter.checkCredit(1));
    ASSERT_FALSE(limiter.checkCredit(1));

    currentTime = timestamp + std::chrono::seconds(5);
    ASSERT_TRUE(limiter.checkCredit(1));
    ASSERT_TRUE(limiter.checkCredit(1));
    ASSERT_FALSE(limiter.checkCredit(1));
    ASSERT_FALSE(limiter.checkCredit(1));
    ASSERT_FALSE(limiter.checkCredit(1));
}